

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O1

DdNode * cuddSubsetShortPaths(DdManager *dd,DdNode *f,int numVars,int threshold,int hardlimit)

{
  FILE *__s;
  DdNode **ppDVar1;
  int *piVar2;
  AssortedInfo *pathLengthArray;
  st__table *table;
  NodeDist_t **ppNVar3;
  NodeDist_t *pNVar4;
  DdNode ***pppDVar5;
  AssortedInfo *info;
  st__table *psVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int in_R9D;
  uint uVar11;
  long lVar12;
  uint uVar13;
  NodeDist_t *nodeStat;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int *local_38;
  
  one = dd->one;
  zero = (DdNode *)((ulong)one ^ 1);
  if (numVars == 0) {
    numVars = Cudd_ReadSize(dd);
  }
  uVar11 = 0;
  if (numVars < threshold) {
    uVar11 = numVars;
  }
  if (f == (DdNode *)0x0) {
    fwrite("Cannot partition, nil object\n",0x1d,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
    return (DdNode *)0x0;
  }
  piVar2 = (int *)((ulong)f & 0xfffffffffffffffe);
  if (*piVar2 == 0x7fffffff) {
    return f;
  }
  pathLengthArray = (AssortedInfo *)malloc((long)numVars * 4 + 4);
  if (-1 < numVars) {
    memset(pathLengthArray,0,(ulong)(uint)numVars * 4 + 4);
  }
  __s = (FILE *)dd->err;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  maxNodeDistPages = 0x80;
  ppNVar3 = (NodeDist_t **)malloc(0x400);
  nodeDistPages = ppNVar3;
  if (ppNVar3 == (NodeDist_t **)0x0) {
LAB_007923f9:
    fwrite("Out of Memory, cannot allocate pages\n",0x25,1,__s);
    memOut = 1;
LAB_0079241b:
    table = (st__table *)0x0;
  }
  else {
    nodeDistPage = 0;
    pNVar4 = (NodeDist_t *)malloc(0x10000);
    *ppNVar3 = pNVar4;
    currentNodeDistPage = pNVar4;
    if (pNVar4 == (NodeDist_t *)0x0) {
      free(ppNVar3);
      nodeDistPages = (NodeDist_t **)0x0;
      goto LAB_007923f9;
    }
    nodeDistPageIndex = 0;
    maxQueuePages = 0x80;
    pppDVar5 = (DdNode ***)malloc(0x400);
    queuePages = pppDVar5;
    if (pppDVar5 == (DdNode ***)0x0) goto LAB_007923f9;
    queuePage = 0;
    currentQueuePage = (DdNode **)malloc(0x4000);
    *pppDVar5 = currentQueuePage;
    if (currentQueuePage == (DdNode **)0x0) {
      free(pppDVar5);
      queuePages = (DdNode ***)0x0;
      goto LAB_007923f9;
    }
    *currentQueuePage = f;
    queuePageIndex = 1;
    if (memOut == 1) {
      if (*ppNVar3 != (NodeDist_t *)0x0) {
        free(*ppNVar3);
        *ppNVar3 = (NodeDist_t *)0x0;
      }
      free(ppNVar3);
      nodeDistPages = (NodeDist_t **)0x0;
      if (*pppDVar5 != (DdNode **)0x0) {
        free(*pppDVar5);
        *pppDVar5 = (DdNode **)0x0;
      }
LAB_00792388:
      free(pppDVar5);
      queuePages = (DdNode ***)0x0;
LAB_00792398:
      st__free_table(table);
      goto LAB_007923f9;
    }
    nodeDistPageIndex = 1;
    pNVar4->oddTopDist = 0xffffffff;
    pNVar4->evenTopDist = 0xffffffff;
    pNVar4->oddBotDist = 0xffffffff;
    pNVar4->evenBotDist = 0xffffffff;
    pNVar4->regResult = (DdNode *)0x0;
    pNVar4->compResult = (DdNode *)0x0;
    iVar9 = st__insert(table,(char *)piVar2,(char *)pNVar4);
    ppNVar3 = nodeDistPages;
    if (iVar9 == 1) {
      fwrite("Something wrong, the entry exists but didnt show up in st__lookup\n",0x42,1,__s);
      goto LAB_0079241b;
    }
    if (iVar9 == -10000) {
      memOut = 1;
      uVar7 = (ulong)(uint)nodeDistPage;
      if (-1 < nodeDistPage) {
        lVar12 = 0;
        do {
          pNVar4 = ppNVar3[lVar12];
          if (pNVar4 != (NodeDist_t *)0x0) {
            free(pNVar4);
            ppNVar3[lVar12] = (NodeDist_t *)0x0;
          }
          lVar12 = lVar12 + 1;
        } while (uVar7 + 1 != lVar12);
      }
      if (nodeDistPages != (NodeDist_t **)0x0) {
        free(nodeDistPages);
        nodeDistPages = (NodeDist_t **)0x0;
      }
      pppDVar5 = queuePages;
      uVar7 = (ulong)(uint)queuePage;
      if (-1 < queuePage) {
        lVar12 = 0;
        do {
          ppDVar1 = pppDVar5[lVar12];
          if (ppDVar1 != (DdNode **)0x0) {
            free(ppDVar1);
            pppDVar5[lVar12] = (DdNode **)0x0;
          }
          lVar12 = lVar12 + 1;
        } while (uVar7 + 1 != lVar12);
      }
      pppDVar5 = queuePages;
      if (queuePages != (DdNode ***)0x0) goto LAB_00792388;
      goto LAB_00792398;
    }
    if (((ulong)f & 1) == 0) {
      pNVar4->evenTopDist = 0;
    }
    else {
      pNVar4->oddTopDist = 0;
    }
    CreateTopDist(table,0,0,0,(DdNode **)0x1,in_R9D,in_stack_ffffffffffffff88,
                  (FILE *)CONCAT44(threshold,in_stack_ffffffffffffff90));
    if (memOut == 1) {
      fwrite("Out of Memory and cant count path lengths\n",0x2a,1,__s);
      goto LAB_007923f9;
    }
    iVar9 = CreateBotDist(f,table,(uint *)pathLengthArray,(FILE *)__s);
    pppDVar5 = queuePages;
    if (iVar9 == 0) goto LAB_0079241b;
    uVar7 = (ulong)(uint)queuePage;
    if (-1 < queuePage) {
      lVar12 = 0;
      do {
        ppDVar1 = pppDVar5[lVar12];
        if (ppDVar1 != (DdNode **)0x0) {
          free(ppDVar1);
          pppDVar5[lVar12] = (DdNode **)0x0;
        }
        lVar12 = lVar12 + 1;
      } while (uVar7 + 1 != lVar12);
    }
    if (queuePages != (DdNode ***)0x0) {
      free(queuePages);
      queuePages = (DdNode ***)0x0;
    }
  }
  if ((table == (st__table *)0x0) || ((memOut & 1) != 0)) {
    if (table != (st__table *)0x0) {
      st__free_table(table);
    }
    if (pathLengthArray == (AssortedInfo *)0x0) {
      return (DdNode *)0x0;
    }
LAB_007925d9:
    free(pathLengthArray);
  }
  else {
    iVar8 = threshold - uVar11;
    uVar11 = numVars + 1;
    uVar13 = 0;
    iVar9 = iVar8;
    if (0 < iVar8 && uVar11 != 0) {
      uVar7 = 0;
      uVar13 = 0;
      do {
        iVar9 = iVar9 - (&pathLengthArray->maxpath)[uVar7];
        uVar10 = (uint)uVar7;
        if ((&pathLengthArray->maxpath)[uVar7] == 0) {
          uVar10 = uVar13;
        }
        uVar13 = uVar10;
        uVar7 = uVar7 + 1;
      } while ((uVar7 < uVar11) && (0 < iVar9));
    }
    if (iVar9 < 0) {
      iVar9 = iVar9 + (&pathLengthArray->maxpath)[uVar13];
    }
    else {
      uVar13 = uVar13 + 1;
      iVar9 = 0;
    }
    if (uVar13 == 0) {
      fwrite("Path Length array seems to be all zeroes, check\n",0x30,1,(FILE *)dd->err);
    }
    if (uVar13 == uVar11) {
      piVar2[1] = piVar2[1] + 1;
    }
    else {
      info = (AssortedInfo *)malloc(0x20);
      info->maxpath = uVar13;
      info->findShortestPath = 0;
      info->thresholdReached = iVar9;
      psVar6 = st__init_table(st__ptrcmp,st__ptrhash);
      info->maxpathTable = psVar6;
      info->threshold = iVar8;
      iVar9 = st__lookup(table,(char *)piVar2,(char **)&local_38);
      if (iVar9 == 0) {
        fwrite("Something wrong, root node must be in table\n",0x2c,1,(FILE *)dd->err);
        dd->errorCode = CUDD_INTERNAL_ERROR;
        pathLengthArray = info;
        goto LAB_007925d9;
      }
      uVar11 = 0xffffffff;
      uVar10 = 0xffffffff;
      if ((*local_38 != -1) && (uVar10 = *local_38 + local_38[2], local_38[2] == -1)) {
        uVar10 = 0xffffffff;
      }
      if ((local_38[1] != -1) && (uVar11 = local_38[1] + local_38[3], local_38[3] == -1)) {
        uVar11 = 0xffffffff;
      }
      if (uVar10 < uVar11) {
        uVar11 = uVar10;
      }
      if (uVar13 < uVar11) {
        fprintf((FILE *)dd->err,
                "All computations are bogus, since root has path length greater than max path length within threshold %u, %u\n"
                ,(ulong)uVar13);
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return (DdNode *)0x0;
      }
      if (hardlimit == 0) {
        psVar6 = (st__table *)0x0;
      }
      else {
        psVar6 = st__init_table(st__ptrcmp,st__ptrhash);
      }
      f = BuildSubsetBdd(dd,table,f,info,psVar6);
      if (f != (DdNode *)0x0) {
        piVar2 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + 1;
      }
      if (psVar6 != (st__table *)0x0) {
        st__free_table(psVar6);
      }
      st__free_table(info->maxpathTable);
      st__foreach(table,stPathTableDdFree,(char *)dd);
      free(info);
    }
    st__free_table(table);
    if (pathLengthArray != (AssortedInfo *)0x0) {
      free(pathLengthArray);
    }
    ppNVar3 = nodeDistPages;
    uVar7 = (ulong)(uint)nodeDistPage;
    if (-1 < nodeDistPage) {
      lVar12 = 0;
      do {
        pNVar4 = ppNVar3[lVar12];
        if (pNVar4 != (NodeDist_t *)0x0) {
          free(pNVar4);
          ppNVar3[lVar12] = (NodeDist_t *)0x0;
        }
        lVar12 = lVar12 + 1;
      } while (uVar7 + 1 != lVar12);
    }
    if (nodeDistPages != (NodeDist_t **)0x0) {
      free(nodeDistPages);
      nodeDistPages = (NodeDist_t **)0x0;
    }
    if (f != (DdNode *)0x0) {
      piVar2 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + -1;
      return f;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddSubsetShortPaths(
  DdManager * dd /* DD manager */,
  DdNode * f /* function to be subset */,
  int  numVars /* total number of variables in consideration */,
  int  threshold /* maximum number of nodes allowed in the subset */,
  int  hardlimit /* flag determining whether thershold should be respected strictly */)
{
    st__table *pathTable;
    DdNode *N, *subset;

    unsigned int  *pathLengthArray;
    unsigned int maxpath, oddLen, evenLen, pathLength, *excess;
    int i;
    NodeDist_t  *nodeStat;
    struct AssortedInfo *info;
    st__table *subsetNodeTable;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    if (numVars == 0) {
      /* set default value */
      numVars = Cudd_ReadSize(dd);
    }

    if (threshold > numVars) {
        threshold = threshold - numVars;
    }
    if (f == NULL) {
        fprintf(dd->err, "Cannot partition, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }
    if (Cudd_IsConstant(f))
        return (f);

    pathLengthArray = ABC_ALLOC(unsigned int, numVars+1);
    for (i = 0; i < numVars+1; i++) pathLengthArray[i] = 0;


#ifdef DD_DEBUG
    numCalls = 0;
#endif

    pathTable = CreatePathTable(f, pathLengthArray, dd->err);

    if ((pathTable == NULL) || (memOut)) {
        if (pathTable != NULL)
            st__free_table(pathTable);
        ABC_FREE(pathLengthArray);
        return (NIL(DdNode));
    }

    excess = ABC_ALLOC(unsigned int, 1);
    *excess = 0;
    maxpath = AssessPathLength(pathLengthArray, threshold, numVars, excess,
                               dd->err);

    if (maxpath != (unsigned) (numVars + 1)) {

        info = ABC_ALLOC(struct AssortedInfo, 1);
        info->maxpath = maxpath;
        info->findShortestPath = 0;
        info->thresholdReached = *excess;
        info->maxpathTable = st__init_table( st__ptrcmp, st__ptrhash);
        info->threshold = threshold;

#ifdef DD_DEBUG
        (void) fprintf(dd->out, "Path length array\n");
        for (i = 0; i < (numVars+1); i++) {
            if (pathLengthArray[i])
                (void) fprintf(dd->out, "%d ",i);
        }
        (void) fprintf(dd->out, "\n");
        for (i = 0; i < (numVars+1); i++) {
            if (pathLengthArray[i])
                (void) fprintf(dd->out, "%d ",pathLengthArray[i]);
        }
        (void) fprintf(dd->out, "\n");
        (void) fprintf(dd->out, "Maxpath  = %d, Thresholdreached = %d\n",
                       maxpath, info->thresholdReached);
#endif

        N = Cudd_Regular(f);
        if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
            fprintf(dd->err, "Something wrong, root node must be in table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            ABC_FREE(excess);
            ABC_FREE(info);
            return(NULL);
        } else {
            if ((nodeStat->oddTopDist != MAXSHORTINT) &&
                (nodeStat->oddBotDist != MAXSHORTINT))
                oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
            else
                oddLen = MAXSHORTINT;

            if ((nodeStat->evenTopDist != MAXSHORTINT) &&
                (nodeStat->evenBotDist != MAXSHORTINT))
                evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
            else
                evenLen = MAXSHORTINT;

            pathLength = (oddLen <= evenLen) ? oddLen : evenLen;
            if (pathLength > maxpath) {
                (void) fprintf(dd->err, "All computations are bogus, since root has path length greater than max path length within threshold %u, %u\n", maxpath, pathLength);
                dd->errorCode = CUDD_INTERNAL_ERROR;
                return(NULL);
            }
        }

#ifdef DD_DEBUG
        numCalls = 0;
        hits = 0;
        thishit = 0;
#endif
        /* initialize a table to store computed nodes */
        if (hardlimit) {
            subsetNodeTable = st__init_table( st__ptrcmp, st__ptrhash);
        } else {
            subsetNodeTable = NIL( st__table);
        }
        subset = BuildSubsetBdd(dd, pathTable, f, info, subsetNodeTable);
        if (subset != NULL) {
            cuddRef(subset);
        }
        /* record the number of times a computed result for a node is hit */

#ifdef DD_DEBUG
        (void) fprintf(dd->out, "Hits = %d, New==Node = %d, NumCalls = %d\n",
                hits, thishit, numCalls);
#endif

        if (subsetNodeTable != NIL( st__table)) {
            st__free_table(subsetNodeTable);
        }
        st__free_table(info->maxpathTable);
        st__foreach(pathTable, stPathTableDdFree, (char *)dd);

        ABC_FREE(info);

    } else {/* if threshold larger than size of dd */
        subset = f;
        cuddRef(subset);
    }
    ABC_FREE(excess);
    st__free_table(pathTable);
    ABC_FREE(pathLengthArray);
    for (i = 0; i <= nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
    ABC_FREE(nodeDistPages);

#ifdef DD_DEBUG
    /* check containment of subset in f */
    if (subset != NULL) {
        DdNode *check;
        check = Cudd_bddIteConstant(dd, subset, f, one);
        if (check != one) {
            (void) fprintf(dd->err, "Wrong partition\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
    }
#endif

    if (subset != NULL) {
        cuddDeref(subset);
        return(subset);
    } else {
        return(NULL);
    }

}